

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O2

void __thiscall cmCTestGlobalVC::WriteXMLGlobal(cmCTestGlobalVC *this,cmXMLWriter *xml)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  
  if ((this->NewRevision)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_38,"Revision",&local_39);
    cmXMLWriter::Element<std::__cxx11::string>(xml,&local_38,&this->NewRevision);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((this->OldRevision)._M_string_length != 0) {
    bVar1 = std::operator!=(&this->OldRevision,&this->NewRevision);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_38,"PriorRevision",&local_39);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_38,&this->OldRevision);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return;
}

Assistant:

void cmCTestGlobalVC::WriteXMLGlobal(cmXMLWriter& xml)
{
  if(!this->NewRevision.empty())
    {
    xml.Element("Revision", this->NewRevision);
    }
  if(!this->OldRevision.empty() && this->OldRevision != this->NewRevision)
    {
    xml.Element("PriorRevision", this->OldRevision);
    }
}